

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

int secp256k1_ge_set_xo_var(secp256k1_ge *r,secp256k1_fe *x,int odd)

{
  secp256k1_fe *r_00;
  int iVar1;
  
  iVar1 = secp256k1_ge_set_xquad(r,x);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    r_00 = &r->y;
    secp256k1_fe_normalize_var(r_00);
    if (((uint)(r->y).n[0] & 1) == odd) {
      iVar1 = 1;
    }
    else {
      iVar1 = 1;
      secp256k1_fe_negate(r_00,r_00,1);
    }
  }
  return iVar1;
}

Assistant:

static int secp256k1_ge_set_xo_var(secp256k1_ge *r, const secp256k1_fe *x, int odd) {
    if (!secp256k1_ge_set_xquad(r, x)) {
        return 0;
    }
    secp256k1_fe_normalize_var(&r->y);
    if (secp256k1_fe_is_odd(&r->y) != odd) {
        secp256k1_fe_negate(&r->y, &r->y, 1);
    }
    return 1;

}